

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

StringTree *
kj::_::CopyConstructArray_<kj::StringTree,_kj::StringTree_*,_true,_false>::apply
          (StringTree *pos,StringTree *start,StringTree *end)

{
  Branch *pBVar1;
  
  if (start != end) {
    do {
      pos->size_ = start->size_;
      (pos->text).content.ptr = (start->text).content.ptr;
      (pos->text).content.size_ = (start->text).content.size_;
      (start->text).content.ptr = (char *)0x0;
      (start->text).content.size_ = 0;
      pBVar1 = (start->branches).ptr;
      (pos->text).content.disposer = (start->text).content.disposer;
      (pos->branches).ptr = pBVar1;
      (pos->branches).size_ = (start->branches).size_;
      (pos->branches).disposer = (start->branches).disposer;
      pos = pos + 1;
      (start->branches).ptr = (Branch *)0x0;
      (start->branches).size_ = 0;
      start = start + 1;
    } while (start != end);
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }